

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_util.h
# Opt level: O2

void google::protobuf::TestUtil::SetDefaultFields<edition_unittest::TestAllTypes>
               (TestAllTypes *message)

{
  byte *pbVar1;
  Reflection *pRVar2;
  Descriptor *pDVar3;
  FieldDescriptor *pFVar4;
  Arena *pAVar5;
  string_view name;
  string_view name_00;
  allocator<char> local_59;
  string local_58;
  string local_38;
  
  *(undefined8 *)((long)&message->field_0 + 0x318) = 0x19300000191;
  (message->field_0)._impl_.default_int64_ = 0x192;
  (message->field_0)._impl_.default_uint64_ = 0x194;
  *(undefined8 *)((long)&message->field_0 + 0x330) = 0x19700000195;
  (message->field_0)._impl_.default_sint64_ = 0x196;
  (message->field_0)._impl_.default_fixed64_ = 0x198;
  *(undefined8 *)((long)&message->field_0 + 0x348) = 0x43cd800000000199;
  (message->field_0)._impl_.default_sfixed64_ = 0x19a;
  (message->field_0)._impl_.default_double_ = 412.0;
  (message->field_0)._impl_.default_bool_ = false;
  *(ulong *)(message->field_0)._impl_._has_bits_.has_bits_ =
       *(ulong *)(message->field_0)._impl_._has_bits_.has_bits_ | 0x1fff08000000;
  pAVar5 = (Arena *)(message->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if (((ulong)pAVar5 & 1) != 0) {
    pAVar5 = *(Arena **)((ulong)pAVar5 & 0xfffffffffffffffe);
  }
  internal::ArenaStringPtr::Set(&(message->field_0)._impl_.default_string_,"415",pAVar5);
  pbVar1 = (byte *)((long)&message->field_0 + 3);
  *pbVar1 = *pbVar1 | 0x10;
  pAVar5 = (Arena *)(message->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if (((ulong)pAVar5 & 1) != 0) {
    pAVar5 = *(Arena **)((ulong)pAVar5 & 0xfffffffffffffffe);
  }
  internal::ArenaStringPtr::Set(&(message->field_0)._impl_.default_bytes_,"416",pAVar5);
  edition_unittest::TestAllTypes::set_default_nested_enum(message,TestAllTypes_NestedEnum_FOO);
  edition_unittest::TestAllTypes::set_default_foreign_enum(message,FOREIGN_FOO);
  edition_unittest::TestAllTypes::set_default_import_enum(message,IMPORT_FOO);
  pRVar2 = edition_unittest::TestAllTypes::GetReflection();
  pDVar3 = edition_unittest::TestAllTypes::GetDescriptor();
  name._M_str = "default_string_piece";
  name._M_len = 0x14;
  pFVar4 = Descriptor::FindFieldByName(pDVar3,name);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"424",&local_59);
  Reflection::SetString(pRVar2,&message->super_Message,pFVar4,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  pRVar2 = edition_unittest::TestAllTypes::GetReflection();
  pDVar3 = edition_unittest::TestAllTypes::GetDescriptor();
  name_00._M_str = "default_cord";
  name_00._M_len = 0xc;
  pFVar4 = Descriptor::FindFieldByName(pDVar3,name_00);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"425",&local_59);
  Reflection::SetString(pRVar2,&message->super_Message,pFVar4,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  return;
}

Assistant:

void SetDefaultFields(TestAllTypes* message) {
  message->set_default_int32(401);
  message->set_default_int64(402);
  message->set_default_uint32(403);
  message->set_default_uint64(404);
  message->set_default_sint32(405);
  message->set_default_sint64(406);
  message->set_default_fixed32(407);
  message->set_default_fixed64(408);
  message->set_default_sfixed32(409);
  message->set_default_sfixed64(410);
  message->set_default_float(411);
  message->set_default_double(412);
  message->set_default_bool(false);
  message->set_default_string("415");
  message->set_default_bytes("416");

  message->set_default_nested_enum(TestAllTypes::FOO);
  message->set_default_foreign_enum(ForeignEnum<TestAllTypes>::FOREIGN_FOO);
  message->set_default_import_enum(ImportEnum<TestAllTypes>::IMPORT_FOO);

#ifndef PROTOBUF_TEST_NO_DESCRIPTORS
  message->GetReflection()->SetString(
      message,
      message->GetDescriptor()->FindFieldByName("default_string_piece"), "424");
  message->GetReflection()->SetString(
      message, message->GetDescriptor()->FindFieldByName("default_cord"),
      "425");
#endif  // !PROTOBUF_TEST_NO_DESCRIPTORS
}